

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# show.hpp
# Opt level: O0

string * lambda::show<std::__cxx11::string>(Maybe<std::__cxx11::basic_string<char>_> *maybe)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *in_RDI;
  string *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_87;
  byte local_86;
  byte local_85;
  byte local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  string local_30 [48];
  
  bVar1 = std::experimental::fundamentals_v1::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1878c6);
  local_71 = 0;
  local_85 = 0;
  local_86 = 0;
  if (bVar1) {
    pbVar2 = std::experimental::fundamentals_v1::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1878ea);
    __lhs = &local_70;
    std::__cxx11::string::string((string *)__lhs,(string *)pbVar2);
    local_71 = 1;
    show(in_stack_ffffffffffffff48);
    local_85 = 1;
    std::operator+((char *)__lhs,in_stack_ffffffffffffff50);
    local_86 = 1;
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff50);
  }
  else {
    paVar3 = &local_87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"None",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_87);
  }
  if ((local_86 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  if ((local_85 & 1) != 0) {
    std::__cxx11::string::~string(local_50);
  }
  if ((local_71 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  return in_RDI;
}

Assistant:

std::string show(const Maybe<T> maybe) {
    return maybe ? "Some(" + show(*maybe) + ")" : "None";
}